

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_gc_mark_external_refs_CALL(WorkerP *w,Task *__dq_head)

{
  size_t __dq_head_00;
  WorkerP *w_00;
  uint64_t arg_1;
  Task *__dq_head_local;
  WorkerP *w_local;
  uint64_t *it;
  size_t count;
  WorkerP *local_10;
  
  it = (uint64_t *)0x0;
  count = (size_t)__dq_head;
  local_10 = w;
  w_local = (WorkerP *)refs_iter(&lddmc_refs,0,lddmc_refs.refs_size);
  while (w_00 = local_10, __dq_head_00 = count, w_local != (WorkerP *)0x0) {
    arg_1 = refs_next(&lddmc_refs,(uint64_t **)&w_local,lddmc_refs.refs_size);
    lddmc_gc_mark_rec_SPAWN(w_00,(Task *)__dq_head_00,arg_1);
    count = count + 0x40;
    it = (uint64_t *)((long)it + 1);
  }
  while (it != (uint64_t *)0x0) {
    count = count - 0x40;
    it = (uint64_t *)((long)it + -1);
    lddmc_gc_mark_rec_SYNC(local_10,(Task *)count);
  }
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&lddmc_refs, 0, lddmc_refs.refs_size);
    while (it != NULL) {
        SPAWN(lddmc_gc_mark_rec, refs_next(&lddmc_refs, &it, lddmc_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}